

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

wchar_t canSymlink(void)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t isdir;
  
  if (canSymlink_tested == '\x01') {
    return canSymlink::value;
  }
  canSymlink_tested = 1;
  isdir = L'\x01';
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                      ,L'৉',"canSymlink.0",L'Ƥ',L'\x01',"a");
  iVar1 = symlink("canSymlink.0","canSymlink.1");
  wVar2 = L'\0';
  if (iVar1 == 0) {
    wVar2 = is_symlink("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                       ,L'৒',"canSymlink.1","canSymlink.0",isdir);
  }
  canSymlink::value = wVar2;
  return wVar2;
}

Assistant:

int
canSymlink(void)
{
	/* Remember the test result */
	static int value = 0, tested = 0;
	if (tested)
		return (value);

	++tested;
	assertion_make_file(__FILE__, __LINE__, "canSymlink.0", 0644, 1, "a");
	/* Note: Cygwin has its own symlink() emulation that does not
	 * use the Win32 CreateSymbolicLink() function. */
#if defined(_WIN32) && !defined(__CYGWIN__)
	value = my_CreateSymbolicLinkA("canSymlink.1", "canSymlink.0", 0)
	    && is_symlink(__FILE__, __LINE__, "canSymlink.1", "canSymlink.0",
	    0);
#elif HAVE_SYMLINK
	value = (0 == symlink("canSymlink.0", "canSymlink.1"))
	    && is_symlink(__FILE__, __LINE__, "canSymlink.1","canSymlink.0",
	    0);
#endif
	return (value);
}